

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsRedcostFixing.cpp
# Opt level: O3

void __thiscall
HighsRedcostFixing::addRootRedcost
          (HighsRedcostFixing *this,HighsMipSolver *mipsolver,
          vector<double,_std::allocator<double>_> *lpredcost,double lpobjective)

{
  HighsMipSolverData *pHVar1;
  pointer pmVar2;
  bool bVar3;
  bool bVar4;
  iterator iVar5;
  HighsRedcostFixing *pHVar6;
  long lVar7;
  _Base_ptr p_Var8;
  _Rb_tree_node_base *p_Var9;
  iterator iVar10;
  iterator iVar11;
  uint uVar12;
  int iVar13;
  _Self del;
  const_iterator cVar14;
  int *piVar15;
  _Rb_tree_node_base *p_Var16;
  long lVar17;
  int *piVar18;
  double dVar19;
  HighsInt lb;
  double requiredcutoffbound;
  uint local_8c;
  uint local_88;
  uint local_84;
  double local_80;
  HighsRedcostFixing *local_78;
  long local_70;
  int *local_68;
  HighsMipSolver *local_60;
  vector<double,_std::allocator<double>_> *local_58;
  vector<std::multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>,_std::allocator<std::multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>_>_>
  *local_50;
  int local_44;
  int *local_40;
  double local_38;
  
  local_50 = &this->lurkingColLower;
  local_58 = lpredcost;
  local_38 = lpobjective;
  std::
  vector<std::multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>,_std::allocator<std::multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>_>_>
  ::resize(local_50,(long)mipsolver->model_->num_col_);
  local_78 = this;
  std::
  vector<std::multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>,_std::allocator<std::multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>_>_>
  ::resize(&this->lurkingColUpper,(long)mipsolver->model_->num_col_);
  pHVar1 = (mipsolver->mipdata_)._M_t.
           super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>._M_t.
           super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>.
           super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl;
  HighsLpRelaxation::computeBasicDegenerateDuals(&pHVar1->lp,pHVar1->feastol,(HighsDomain *)0x0);
  pHVar1 = (mipsolver->mipdata_)._M_t.
           super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>._M_t.
           super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>.
           super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl;
  piVar18 = *(int **)&(pHVar1->integral_cols).super__Vector_base<int,_std::allocator<int>_>._M_impl;
  piVar15 = *(pointer *)
             ((long)&(pHVar1->integral_cols).super__Vector_base<int,_std::allocator<int>_> + 8);
  local_60 = mipsolver;
  local_40 = piVar15;
  if (piVar18 != piVar15) {
    do {
      pHVar6 = local_78;
      lVar17 = (long)*piVar18;
      dVar19 = (local_58->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start[lVar17];
      pHVar1 = (local_60->mipdata_)._M_t.
               super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>.
               _M_t.
               super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
               .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl;
      local_70 = lVar17;
      if (dVar19 <= pHVar1->feastol) {
        if (dVar19 < -pHVar1->feastol) {
          local_84 = (uint)*(double *)
                            (*(long *)&(pHVar1->domain).col_upper_.
                                       super__Vector_base<double,_std::allocator<double>_>._M_impl +
                            lVar17 * 8);
          if (dVar19 <= -INFINITY) {
            std::
            _Rb_tree<double,_std::pair<const_double,_int>,_std::_Select1st<std::pair<const_double,_int>_>,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>
            ::clear(&(local_78->lurkingColUpper).
                     super__Vector_base<std::multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>,_std::allocator<std::multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[lVar17]._M_t);
            std::
            _Rb_tree<double,_std::pair<const_double,_int>,_std::_Select1st<std::pair<const_double,_int>_>,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>
            ::clear(&(pHVar6->lurkingColLower).
                     super__Vector_base<std::multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>,_std::allocator<std::multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[lVar17]._M_t);
            pmVar2 = (pHVar6->lurkingColLower).
                     super__Vector_base<std::multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>,_std::allocator<std::multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            goto LAB_002deeb5;
          }
          dVar19 = *(double *)
                    (*(long *)&(pHVar1->domain).col_lower_.
                               super__Vector_base<double,_std::allocator<double>_>._M_impl +
                    lVar17 * 8);
          local_8c = (int)(dVar19 + 1.5);
          if (dVar19 <= -INFINITY) {
            local_8c = local_84 - 0x400;
          }
          local_88 = (local_84 - local_8c) + 0x3ff >> 10;
          if ((int)(local_84 - local_8c) < 0x401) {
            local_88 = 1;
          }
          piVar15 = local_40;
          local_68 = piVar18;
          if ((int)local_8c <= (int)local_84) {
            do {
              lVar17 = local_70;
              pHVar1 = (local_60->mipdata_)._M_t.
                       super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
                       .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl;
              local_80 = pHVar1->feastol;
              local_80 = ((local_80 * 10.0 + (double)(int)(~local_84 + local_8c)) *
                          (local_58->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                          super__Vector_impl_data._M_start[local_70] + local_38) - local_80;
              if (pHVar1->lower_bound <= local_80) {
                pmVar2 = (local_50->
                         super__Vector_base<std::multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>,_std::allocator<std::multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start;
                p_Var16 = &pmVar2[local_70]._M_t._M_impl.super__Rb_tree_header._M_header;
                p_Var8 = *(_Base_ptr *)
                          ((long)&pmVar2[local_70]._M_t._M_impl.super__Rb_tree_header + 8);
                cVar14._M_node = p_Var16;
                if (p_Var8 != (_Rb_tree_node_base *)0x0) {
                  do {
                    bVar3 = local_80 != *(double *)(p_Var8 + 1);
                    bVar4 = *(double *)(p_Var8 + 1) <= local_80;
                    if (!bVar4 || !bVar3) {
                      cVar14._M_node = p_Var8;
                    }
                    p_Var8 = (&p_Var8->_M_left)[bVar4 && bVar3];
                  } while (p_Var8 != (_Base_ptr)0x0);
                  if (cVar14._M_node != p_Var16) {
                    iVar13 = local_8c - local_88;
                    p_Var9 = cVar14._M_node;
                    do {
                      if (iVar13 < *(int *)&p_Var9[1]._M_parent) goto LAB_002decb8;
                      p_Var9 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var9);
                    } while (p_Var9 != p_Var16);
                  }
                }
                iVar10 = std::
                         _Rb_tree<double,std::pair<double_const,int>,std::_Select1st<std::pair<double_const,int>>,std::less<double>,std::allocator<std::pair<double_const,int>>>
                         ::_M_emplace_hint_equal<double&,int&>
                                   ((_Rb_tree<double,std::pair<double_const,int>,std::_Select1st<std::pair<double_const,int>>,std::less<double>,std::allocator<std::pair<double_const,int>>>
                                     *)(pmVar2 + lVar17),cVar14,&local_80,(int *)&local_8c);
                iVar11._M_node =
                     *(_Base_ptr *)
                      ((long)&(local_50->
                              super__Vector_base<std::multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>,_std::allocator<std::multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start[lVar17]._M_t._M_impl.
                              super__Rb_tree_header + 0x10);
                uVar12 = local_8c;
                while (iVar5._M_node = iVar11._M_node, local_8c = uVar12,
                      iVar5._M_node != iVar10._M_node) {
                  iVar13 = *(int *)&iVar5._M_node[1]._M_parent;
                  iVar11._M_node = (_Base_ptr)std::_Rb_tree_increment(iVar5._M_node);
                  bVar3 = iVar13 <= (int)uVar12;
                  uVar12 = local_8c;
                  if (bVar3) {
                    std::
                    _Rb_tree<double,std::pair<double_const,int>,std::_Select1st<std::pair<double_const,int>>,std::less<double>,std::allocator<std::pair<double_const,int>>>
                    ::erase_abi_cxx11_((_Rb_tree<double,std::pair<double_const,int>,std::_Select1st<std::pair<double_const,int>>,std::less<double>,std::allocator<std::pair<double_const,int>>>
                                        *)((local_50->
                                           super__Vector_base<std::multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>,_std::allocator<std::multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>_>_>
                                           )._M_impl.super__Vector_impl_data._M_start + lVar17),
                                       iVar5);
                    uVar12 = local_8c;
                  }
                }
              }
LAB_002decb8:
              local_8c = local_8c + local_88;
              piVar15 = local_40;
              piVar18 = local_68;
            } while ((int)local_8c <= (int)local_84);
          }
        }
      }
      else {
        uVar12 = (uint)*(double *)
                        (*(long *)&(pHVar1->domain).col_lower_.
                                   super__Vector_base<double,_std::allocator<double>_>._M_impl +
                        lVar17 * 8);
        local_84 = uVar12;
        if (INFINITY <= dVar19) {
          std::
          _Rb_tree<double,_std::pair<const_double,_int>,_std::_Select1st<std::pair<const_double,_int>_>,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>
          ::clear(&(local_78->lurkingColUpper).
                   super__Vector_base<std::multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>,_std::allocator<std::multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[lVar17]._M_t);
          std::
          _Rb_tree<double,_std::pair<const_double,_int>,_std::_Select1st<std::pair<const_double,_int>_>,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>
          ::clear(&(pHVar6->lurkingColLower).
                   super__Vector_base<std::multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>,_std::allocator<std::multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[lVar17]._M_t);
          pmVar2 = (pHVar6->lurkingColUpper).
                   super__Vector_base<std::multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>,_std::allocator<std::multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
LAB_002deeb5:
          local_80 = -INFINITY;
          std::
          _Rb_tree<double,std::pair<double_const,int>,std::_Select1st<std::pair<double_const,int>>,std::less<double>,std::allocator<std::pair<double_const,int>>>
          ::_M_emplace_equal<double,int&>
                    ((_Rb_tree<double,std::pair<double_const,int>,std::_Select1st<std::pair<double_const,int>>,std::less<double>,std::allocator<std::pair<double_const,int>>>
                      *)((long)pmVar2 + lVar17 * 0x30),&local_80,(int *)&local_84);
        }
        else {
          dVar19 = *(double *)
                    (*(long *)&(pHVar1->domain).col_upper_.
                               super__Vector_base<double,_std::allocator<double>_>._M_impl +
                    lVar17 * 8);
          if (dVar19 < INFINITY) {
            local_68 = piVar18;
            dVar19 = floor(dVar19 + -0.5);
            local_44 = (int)dVar19;
          }
          else {
            local_44 = uVar12 + 0x400;
            local_68 = piVar18;
          }
          local_88 = (local_44 - uVar12) + 0x3ff >> 10;
          if ((int)(local_44 - uVar12) < 0x401) {
            local_88 = 1;
          }
          piVar15 = local_40;
          piVar18 = local_68;
          local_8c = uVar12;
          if ((int)uVar12 <= local_44) {
            do {
              lVar7 = local_70;
              pHVar1 = (local_60->mipdata_)._M_t.
                       super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
                       .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl;
              local_80 = (pHVar1->feastol * -10.0 + (double)(int)((uVar12 - local_84) + 1)) *
                         (local_58->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                         super__Vector_impl_data._M_start[lVar17] + local_38;
              local_8c = uVar12;
              if (pHVar1->lower_bound <= local_80) {
                pmVar2 = (local_78->lurkingColUpper).
                         super__Vector_base<std::multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>,_std::allocator<std::multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                p_Var16 = (_Rb_tree_node_base *)((long)&pmVar2[local_70]._M_t._M_impl + 8);
                p_Var8 = *(_Base_ptr *)((long)&pmVar2[local_70]._M_t._M_impl + 0x10);
                cVar14._M_node = p_Var16;
                if (p_Var8 != (_Rb_tree_node_base *)0x0) {
                  do {
                    bVar3 = local_80 != *(double *)(p_Var8 + 1);
                    bVar4 = *(double *)(p_Var8 + 1) <= local_80;
                    if (!bVar4 || !bVar3) {
                      cVar14._M_node = p_Var8;
                    }
                    p_Var8 = (&p_Var8->_M_left)[bVar4 && bVar3];
                  } while (p_Var8 != (_Base_ptr)0x0);
                  if (cVar14._M_node != p_Var16) {
                    iVar13 = uVar12 + local_88;
                    p_Var9 = cVar14._M_node;
                    do {
                      if (*(int *)&p_Var9[1]._M_parent < iVar13) goto LAB_002dee64;
                      p_Var9 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var9);
                    } while (p_Var9 != p_Var16);
                  }
                }
                iVar10 = std::
                         _Rb_tree<double,std::pair<double_const,int>,std::_Select1st<std::pair<double_const,int>>,std::less<double>,std::allocator<std::pair<double_const,int>>>
                         ::_M_emplace_hint_equal<double&,int&>
                                   ((_Rb_tree<double,std::pair<double_const,int>,std::_Select1st<std::pair<double_const,int>>,std::less<double>,std::allocator<std::pair<double_const,int>>>
                                     *)(pmVar2 + lVar7),cVar14,&local_80,(int *)&local_8c);
                iVar11._M_node =
                     *(_Base_ptr *)
                      ((long)&(local_78->lurkingColUpper).
                              super__Vector_base<std::multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>,_std::allocator<std::multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[lVar7]._M_t._M_impl + 0x18);
                uVar12 = local_8c;
                while (iVar5._M_node = iVar11._M_node, local_8c = uVar12,
                      iVar5._M_node != iVar10._M_node) {
                  iVar13 = *(int *)&iVar5._M_node[1]._M_parent;
                  iVar11._M_node = (_Base_ptr)std::_Rb_tree_increment(iVar5._M_node);
                  bVar3 = (int)uVar12 <= iVar13;
                  uVar12 = local_8c;
                  if (bVar3) {
                    std::
                    _Rb_tree<double,std::pair<double_const,int>,std::_Select1st<std::pair<double_const,int>>,std::less<double>,std::allocator<std::pair<double_const,int>>>
                    ::erase_abi_cxx11_((_Rb_tree<double,std::pair<double_const,int>,std::_Select1st<std::pair<double_const,int>>,std::less<double>,std::allocator<std::pair<double_const,int>>>
                                        *)((local_78->lurkingColUpper).
                                           super__Vector_base<std::multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>,_std::allocator<std::multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start + lVar7),iVar5)
                    ;
                    uVar12 = local_8c;
                  }
                }
              }
LAB_002dee64:
              uVar12 = local_8c + local_88;
              piVar15 = local_40;
              lVar17 = local_70;
              piVar18 = local_68;
              local_8c = uVar12;
            } while ((int)uVar12 <= local_44);
          }
        }
      }
      piVar18 = piVar18 + 1;
    } while (piVar18 != piVar15);
  }
  return;
}

Assistant:

void HighsRedcostFixing::addRootRedcost(const HighsMipSolver& mipsolver,
                                        const std::vector<double>& lpredcost,
                                        double lpobjective) {
  lurkingColLower.resize(mipsolver.numCol());
  lurkingColUpper.resize(mipsolver.numCol());

  mipsolver.mipdata_->lp.computeBasicDegenerateDuals(
      mipsolver.mipdata_->feastol);

  for (HighsInt col : mipsolver.mipdata_->integral_cols) {
    if (lpredcost[col] > mipsolver.mipdata_->feastol) {
      // col <= (cutoffbound - lpobj)/redcost + lb
      // so for lurkub = lb to ub - 1 we can compute the necessary cutoff
      // bound to reach this bound which is:
      //  lurkub = (cutoffbound - lpobj)/redcost + lb
      //  cutoffbound = (lurkub - lb) * redcost + lpobj
      HighsInt lb = (HighsInt)mipsolver.mipdata_->domain.col_lower_[col];

      if (lpredcost[col] == kHighsInf) {
        lurkingColUpper[col].clear();
        lurkingColLower[col].clear();
        lurkingColUpper[col].emplace(-kHighsInf, lb);
        continue;
      }

      HighsInt maxub;
      if (mipsolver.mipdata_->domain.col_upper_[col] == kHighsInf)
        maxub = lb + 1024;
      else
        maxub = (HighsInt)std::floor(
            mipsolver.mipdata_->domain.col_upper_[col] - 0.5);

      HighsInt step = 1;
      if (maxub - lb > 1024) step = (maxub - lb + 1023) >> 10;

      for (HighsInt lurkub = lb; lurkub <= maxub; lurkub += step) {
        double fracbound = (lurkub - lb + 1) - 10 * mipsolver.mipdata_->feastol;
        double requiredcutoffbound = fracbound * lpredcost[col] + lpobjective;
        if (requiredcutoffbound < mipsolver.mipdata_->lower_bound) continue;
        bool useful = true;

        // check if we already have a better lurking bound stored
        auto pos = lurkingColUpper[col].lower_bound(requiredcutoffbound);
        for (auto it = pos; it != lurkingColUpper[col].end(); ++it) {
          if (it->second < lurkub + step) {
            useful = false;
            break;
          }
        }

        if (!useful) continue;

        // we have no better lurking bound stored store this lurking bound and
        // check if it dominates one that is already stored
        auto it =
            lurkingColUpper[col].emplace_hint(pos, requiredcutoffbound, lurkub);

        auto i = lurkingColUpper[col].begin();
        while (i != it) {
          if (i->second >= lurkub) {
            auto del = i++;
            lurkingColUpper[col].erase(del);
          } else {
            ++i;
          }
        }
      }
    } else if (lpredcost[col] < -mipsolver.mipdata_->feastol) {
      // col >= (cutoffbound - lpobj)/redcost + ub
      // so for lurklb = lb + 1 to ub we can compute the necessary cutoff
      // bound to reach this bound which is:
      //  lurklb = (cutoffbound - lpobj)/redcost + ub
      //  cutoffbound = (lurklb - ub) * redcost + lpobj

      HighsInt ub = (HighsInt)mipsolver.mipdata_->domain.col_upper_[col];

      if (lpredcost[col] == -kHighsInf) {
        lurkingColUpper[col].clear();
        lurkingColLower[col].clear();
        lurkingColLower[col].emplace(-kHighsInf, ub);
        continue;
      }

      HighsInt minlb;
      if (mipsolver.mipdata_->domain.col_lower_[col] == -kHighsInf)
        minlb = ub - 1024;
      else
        minlb = (HighsInt)(mipsolver.mipdata_->domain.col_lower_[col] + 1.5);

      HighsInt step = 1;
      if (ub - minlb > 1024) step = (ub - minlb + 1023) >> 10;

      for (HighsInt lurklb = minlb; lurklb <= ub; lurklb += step) {
        double fracbound = (lurklb - ub - 1) + 10 * mipsolver.mipdata_->feastol;
        double requiredcutoffbound = fracbound * lpredcost[col] + lpobjective -
                                     mipsolver.mipdata_->feastol;
        if (requiredcutoffbound < mipsolver.mipdata_->lower_bound) continue;
        bool useful = true;

        // check if we already have a better lurking bound stored
        auto pos = lurkingColLower[col].lower_bound(requiredcutoffbound);
        for (auto it = pos; it != lurkingColLower[col].end(); ++it) {
          if (it->second > lurklb - step) {
            useful = false;
            break;
          }
        }

        if (!useful) continue;

        // we have no better lurking bound stored store this lurking bound and
        // check if it dominates one that is already stored
        auto it =
            lurkingColLower[col].emplace_hint(pos, requiredcutoffbound, lurklb);

        auto i = lurkingColLower[col].begin();
        while (i != it) {
          if (i->second <= lurklb) {
            auto del = i++;
            lurkingColLower[col].erase(del);
          } else {
            ++i;
          }
        }
      }
    }
  }
}